

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_18::Inlining::run(Inlining *this,Module *module_)

{
  mapped_type mVar1;
  bool bVar2;
  reference ppFVar3;
  pointer this_00;
  reference pNVar4;
  mapped_type *pmVar5;
  undefined1 auStack_138 [8];
  Name name;
  __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_> local_120;
  iterator __end4;
  iterator __begin4;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *__range4;
  vector<wasm::Name,_std::allocator<wasm::Name>_> splitNames;
  Function *func_1;
  iterator __end3_1;
  iterator __begin3_1;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  *__range3_1;
  Function *func;
  iterator __end3;
  iterator __begin3;
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  *__range3;
  undefined1 local_a0 [8];
  unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
  inlinedInto;
  size_t MaxIterationsForFunc;
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  iterationCounts;
  size_type numOriginalFunctions;
  Index iterationNumber;
  Module *module__local;
  Inlining *this_local;
  
  this->module = module_;
  numOriginalFunctions._4_4_ = 0;
  iterationCounts._M_h._M_single_bucket =
       (__node_base_ptr)
       std::
       vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
       ::size(&this->module->functions);
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::unordered_map((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                   *)&MaxIterationsForFunc);
  inlinedInto._M_h._M_single_bucket = (__node_base_ptr)0x5;
  do {
    if (iterationCounts._M_h._M_single_bucket < (__node_base_ptr)(ulong)numOriginalFunctions._4_4_)
    break;
    numOriginalFunctions._4_4_ = numOriginalFunctions._4_4_ + 1;
    std::
    unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
    ::unordered_set((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                     *)local_a0);
    prepare(this);
    iteration(this,(unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                    *)local_a0);
    bVar2 = std::
            unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
            ::empty((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                     *)local_a0);
    if (bVar2) {
      bVar2 = true;
    }
    else {
      __end3 = std::
               unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
               ::begin((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                        *)local_a0);
      func = (Function *)
             std::
             unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
             ::end((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                    *)local_a0);
      while (bVar2 = std::__detail::operator!=
                               (&__end3.super__Node_iterator_base<wasm::Function_*,_false>,
                                (_Node_iterator_base<wasm::Function_*,_false> *)&func), bVar2) {
        ppFVar3 = std::__detail::_Node_iterator<wasm::Function_*,_true,_false>::operator*(&__end3);
        EHUtils::handleBlockNestedPops(*ppFVar3,this->module,SkipIfNoEH);
        std::__detail::_Node_iterator<wasm::Function_*,_true,_false>::operator++(&__end3);
      }
      __end3_1 = std::
                 unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                 ::begin((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                          *)local_a0);
      func_1 = (Function *)
               std::
               unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
               ::end((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                      *)local_a0);
      while (bVar2 = std::__detail::operator!=
                               (&__end3_1.super__Node_iterator_base<wasm::Function_*,_false>,
                                (_Node_iterator_base<wasm::Function_*,_false> *)&func_1), bVar2) {
        ppFVar3 = std::__detail::_Node_iterator<wasm::Function_*,_true,_false>::operator*(&__end3_1)
        ;
        splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)*ppFVar3;
        pmVar5 = std::
                 unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                 ::operator[]((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                               *)&MaxIterationsForFunc,
                              splitNames.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
        mVar1 = *pmVar5;
        *pmVar5 = mVar1 + 1;
        if (4 < mVar1 + 1) {
          bVar2 = true;
          goto LAB_01d662d8;
        }
        std::__detail::_Node_iterator<wasm::Function_*,_true,_false>::operator++(&__end3_1);
      }
      bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->functionSplitter);
      if (bVar2) {
        this_00 = std::
                  unique_ptr<wasm::(anonymous_namespace)::FunctionSplitter,_std::default_delete<wasm::(anonymous_namespace)::FunctionSplitter>_>
                  ::operator->(&this->functionSplitter);
        FunctionSplitter::finish
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range4,this_00);
        __end4 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::begin
                           ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range4);
        local_120._M_current =
             (Name *)std::vector<wasm::Name,_std::allocator<wasm::Name>_>::end
                               ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range4);
        while (bVar2 = __gnu_cxx::operator!=(&__end4,&local_120), bVar2) {
          pNVar4 = __gnu_cxx::
                   __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                   ::operator*(&__end4);
          auStack_138 = (undefined1  [8])(pNVar4->super_IString).str._M_len;
          name.super_IString.str._M_len = (size_t)(pNVar4->super_IString).str._M_str;
          pmVar5 = std::
                   unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                   ::operator[]((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                                 *)&MaxIterationsForFunc,(key_type *)auStack_138);
          mVar1 = *pmVar5;
          *pmVar5 = mVar1 + 1;
          if (4 < mVar1 + 1) {
            bVar2 = true;
            goto LAB_01d662b4;
          }
          __gnu_cxx::
          __normal_iterator<wasm::Name_*,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>::
          operator++(&__end4);
        }
        bVar2 = false;
LAB_01d662b4:
        std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
                  ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)&__range4);
        if (bVar2) goto LAB_01d662d8;
      }
      bVar2 = false;
    }
LAB_01d662d8:
    std::
    unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
    ::~unordered_set((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                      *)local_a0);
  } while (!bVar2);
  std::
  unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<wasm::Name,_unsigned_int,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>_>
                    *)&MaxIterationsForFunc);
  return;
}

Assistant:

void run(Module* module_) override {
    module = module_;

    // No point to do more iterations than the number of functions, as it means
    // we are infinitely recursing (which should be very rare in practice, but
    // it is possible that a recursive call can look like it is worth inlining).
    Index iterationNumber = 0;

    auto numOriginalFunctions = module->functions.size();

    // Track in how many iterations a function was inlined into. We are willing
    // to inline many times into a function within an iteration, as e.g. that
    // helps the case of many calls of a small getter. However, if we only do
    // more inlining in separate iterations then it is likely code that was the
    // result of previous inlinings that is now being inlined into. That is, an
    // old inlining added a call to somewhere, and now we are inlining into that
    // call. This is typically recursion, which to some extent can help, but
    // then like loop unrolling it loses its benefit quickly, so set a limit
    // here.
    //
    // In addition to inlining into a function, we track how many times we do
    // other potentially repetitive operations like splitting a function before
    // inlining, as any such repetitive operation should be limited in how many
    // times we perform it. (An exception is how many times we inlined a
    // function, which we do not want to limit - it can be profitable to inline
    // a call into a great many callsites, over many iterations.)
    //
    // (Track names here, and not Function pointers, as we can remove functions
    // while inlining, and it may be confusing during debugging to have a
    // pointer to something that was removed.)
    std::unordered_map<Name, Index> iterationCounts;

    const size_t MaxIterationsForFunc = 5;

    while (iterationNumber <= numOriginalFunctions) {
#ifdef INLINING_DEBUG
      std::cout << "inlining loop iter " << iterationNumber
                << " (numFunctions: " << module->functions.size() << ")\n";
#endif
      iterationNumber++;

      std::unordered_set<Function*> inlinedInto;

      prepare();
      iteration(inlinedInto);

      if (inlinedInto.empty()) {
        return;
      }

#ifdef INLINING_DEBUG
      std::cout << "  inlined into " << inlinedInto.size() << " funcs.\n";
#endif

      for (auto* func : inlinedInto) {
        EHUtils::handleBlockNestedPops(func, *module);
      }

      for (auto* func : inlinedInto) {
        if (++iterationCounts[func->name] >= MaxIterationsForFunc) {
          return;
        }
      }

      if (functionSplitter) {
        auto splitNames = functionSplitter->finish();
        for (auto name : splitNames) {
          if (++iterationCounts[name] >= MaxIterationsForFunc) {
            return;
          }
        }
      }
    }
  }